

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::texparameteriv(NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType CVar2;
  allocator<char> local_3d;
  GLint params [1];
  string local_38;
  GLuint texture;
  
  params[0] = 0x2601;
  texture = 0x1234;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&texture);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,texture);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target or pname is not one of the accepted defined values."
             ,&local_3d);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0,0x2801,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0,0,params);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value."
             ,&local_3d);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  params[0] = -1;
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x90ea,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x884c,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x884d,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x2800,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x2801,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x8e42,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x8e43,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x8e44,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x8e45,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x2802,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x2803,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x8072,params);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative."
             ,&local_3d);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x813c,params);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x813d,params);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid."
             ,&local_3d);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x1004,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x2801,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x2800,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x2802,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x2803,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x8072,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x813a,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x813b,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x884c,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x884d,params);
  NegativeTestContext::expectError(ctx,0x500);
  CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
  if (bVar1) {
LAB_013300c9:
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x1004,params);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x2801,params);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x2800,params);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x2802,params);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x2803,params);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x8072,params);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x813a,params);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x813b,params);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x884c,params);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x884d,params);
    NegativeTestContext::expectError(ctx,0x500);
  }
  else {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (ctx->m_ctxInfo,"GL_OES_texture_storage_multisample_2d_array");
    if (bVar1) goto LAB_013300c9;
  }
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0."
             ,&local_3d);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  params[0] = 1;
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x813c,params);
  NegativeTestContext::expectError(ctx,0x502);
  CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
  if (!bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (ctx->m_ctxInfo,"GL_OES_texture_storage_multisample_2d_array");
    if (!bVar1) goto LAB_013302d7;
  }
  params[0] = 1;
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x813c,params);
  NegativeTestContext::expectError(ctx,0x502);
LAB_013302d7:
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&texture);
  return;
}

Assistant:

void texparameteriv (NegativeTestContext& ctx)
{
	GLint params[1] = {GL_LINEAR};

	GLuint texture = 0x1234;
	ctx.glGenTextures(1, &texture);
	ctx.glBindTexture(GL_TEXTURE_2D, texture);

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not one of the accepted defined values.");
	ctx.glTexParameteriv(0, GL_TEXTURE_MIN_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, 0, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(0, 0, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value.");
	params[0] = -1;
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_R, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_G, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_B, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_A, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_R, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative.");
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, &params[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, &params[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid.");
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BORDER_COLOR, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAG_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_S, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_T, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_R, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_LOD, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAX_LOD, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_MODE, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_FUNC, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
	{
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BORDER_COLOR, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_FILTER, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAG_FILTER, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_S, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_T, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_R, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_LOD, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAX_LOD, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_MODE, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_FUNC, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
	}
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0.");
	params[0] = 1;
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BASE_LEVEL, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
	{
		params[0] = 1;
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BASE_LEVEL, &params[0]);
		ctx.expectError(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
}